

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O0

commonNaNT * float128ToCommonNaN(commonNaNT *__return_storage_ptr__,float128 a,float_status *status)

{
  int iVar1;
  float_status *status_local;
  float128 a_local;
  
  iVar1 = float128_is_signaling_nan_tricore(a,status);
  if (iVar1 != 0) {
    float_raise_tricore('\x01',status);
  }
  __return_storage_ptr__->sign = a.high._7_1_ >> 7;
  shortShift128Left(a.high,a.low,0x10,&__return_storage_ptr__->high,&__return_storage_ptr__->low);
  return __return_storage_ptr__;
}

Assistant:

static commonNaNT float128ToCommonNaN(float128 a, float_status *status)
{
    commonNaNT z;

    if (float128_is_signaling_nan(a, status)) {
        float_raise(float_flag_invalid, status);
    }
    z.sign = a.high >> 63;
    shortShift128Left(a.high, a.low, 16, &z.high, &z.low);
    return z;
}